

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool c4::yml::anon_unknown_0::_is_doc_sep(csubstr s)

{
  code *pcVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong in_RSI;
  char *in_RDI;
  basic_substring<const_char> local_30;
  basic_substring<const_char> local_20;
  
  if (2 < in_RSI) {
    local_30.str = in_RDI;
    local_30.len = in_RSI;
    if (*in_RDI == '-') {
      uVar2 = 0;
      do {
        uVar7 = uVar2;
        if (uVar7 == 2) break;
        uVar2 = uVar7 + 1;
      } while (in_RDI[uVar7 + 1] == "---"[uVar7 + 1]);
      if (1 < uVar7) {
        iVar6 = basic_substring<const_char>::compare(&local_30,"---",3);
        if (iVar6 == 0) {
          return true;
        }
        if (in_RSI < 3) {
          if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            uVar5 = (*pcVar1)();
            return (bool)uVar5;
          }
          handle_error(0x200e84,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring(&local_20,local_30.str + 3,local_30.len - 3);
        if (local_20.len == 0) {
          return false;
        }
        if (*local_20.str == ' ') {
          return true;
        }
        lVar3 = 0;
        do {
          lVar8 = lVar3;
          if (lVar8 == 1) break;
          lVar3 = lVar8 + 1;
        } while (*local_20.str != " \t"[lVar8 + 1]);
        goto LAB_001e50e9;
      }
    }
    if ((2 < in_RSI) && (*in_RDI == '.')) {
      uVar2 = 0;
      do {
        uVar7 = uVar2;
        if (uVar7 == 2) break;
        uVar2 = uVar7 + 1;
      } while (in_RDI[uVar7 + 1] == "\t..."[uVar7 + 2]);
      if (1 < uVar7) {
        iVar6 = basic_substring<const_char>::compare(&local_30,"...",3);
        if (iVar6 == 0) {
          return true;
        }
        if (in_RSI < 3) {
          if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            uVar5 = (*pcVar1)();
            return (bool)uVar5;
          }
          handle_error(0x200e84,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring(&local_20,local_30.str + 3,local_30.len - 3);
        if (local_20.len != 0) {
          if (*local_20.str == ' ') {
            return true;
          }
          lVar3 = 0;
          do {
            lVar8 = lVar3;
            if (lVar8 == 1) break;
            lVar3 = lVar8 + 1;
          } while (*local_20.str != " \t"[lVar8 + 1]);
LAB_001e50e9:
          return lVar8 == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool _is_doc_sep(csubstr s)
{
    constexpr const csubstr dashes = "---";
    constexpr const csubstr ellipsis = "...";
    constexpr const csubstr whitesp = " \t";
    if(s.begins_with(dashes))
        return s == dashes || s.sub(3).begins_with_any(whitesp);
    else if(s.begins_with(ellipsis))
        return s == ellipsis || s.sub(3).begins_with_any(whitesp);
    return false;
}